

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifyObjLimitReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  bool bVar2;
  bool bVar3;
  type_conflict5 tVar4;
  SPxOut *pSVar5;
  SPxOut *pSVar6;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  Real local_1d8;
  Real local_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar6 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar5 = soplex::operator<<(pSVar6," --- verifying objective limit");
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_178,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1c8,0,(type *)0x0);
  bVar2 = getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_178,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_80);
  bVar3 = getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_1c8,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_80);
  if ((bVar2) && (bVar3)) {
    local_1d0 = Tolerances::floatingPointOpttol
                          ((this->_solver).
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          );
    tVar4 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_178,&local_1d0);
    if (!tVar4) {
      local_1d8 = Tolerances::floatingPointOpttol
                            ((this->_solver).
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
      tVar4 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1c8,&local_1d8);
      if (!tVar4) {
        return;
      }
    }
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_00390b88;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    pSVar5 = soplex::operator<<(pSVar6,", dual violation: ");
    local_d8.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
    local_d8.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
    local_d8.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
    local_d8.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
    local_d8.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
    local_d8.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
    local_d8.m_backend.data._M_elems[6] = local_178.data._M_elems[6];
    local_d8.m_backend.data._M_elems[7] = local_178.data._M_elems[7];
    local_d8.m_backend.data._M_elems[8] = local_178.data._M_elems[8];
    local_d8.m_backend.data._M_elems[9] = local_178.data._M_elems[9];
    local_d8.m_backend.data._M_elems[10] = local_178.data._M_elems[10];
    local_d8.m_backend.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_d8.m_backend.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_d8.m_backend.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_d8.m_backend.data._M_elems[0xe] = local_178.data._M_elems[0xe];
    local_d8.m_backend.data._M_elems[0xf] = local_178.data._M_elems[0xf];
    local_d8.m_backend.exp = local_178.exp;
    local_d8.m_backend.neg = local_178.neg;
    local_d8.m_backend.fpclass = local_178.fpclass;
    local_d8.m_backend.prec_elem = local_178.prec_elem;
    pSVar5 = soplex::operator<<(pSVar5,&local_d8);
    pSVar5 = soplex::operator<<(pSVar5,", redcost violation: ");
    local_128.m_backend.data._M_elems[0] = local_1c8.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_1c8.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_1c8.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_1c8.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = local_1c8.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_1c8.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = local_1c8.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = local_1c8.data._M_elems[7];
    local_128.m_backend.data._M_elems[8] = local_1c8.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = local_1c8.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = local_1c8.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[0xe] = local_1c8.data._M_elems[0xe];
    local_128.m_backend.data._M_elems[0xf] = local_1c8.data._M_elems[0xf];
    local_128.m_backend.exp = local_1c8.exp;
    local_128.m_backend.neg = local_1c8.neg;
    local_128.m_backend.fpclass = local_1c8.fpclass;
    local_128.m_backend.prec_elem = local_1c8.prec_elem;
    pSVar5 = soplex::operator<<(pSVar5,&local_128);
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar6 = soplex::operator<<(pSVar6,
                              " --- detected violations in original problem space -- solve again without presolving/scaling"
                             );
  std::endl<char,std::char_traits<char>>(pSVar6->m_streams[pSVar6->m_verbosity]);
  (this->spxout).m_verbosity = VVar1;
LAB_00390b88:
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0 && this->_scaler ==
                (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    (this->_solver).useTerminationValue = false;
  }
  else if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}